

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::documentChange(QTextDocumentPrivate *this,int from,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->docChangeFrom;
  if (iVar1 < 0) {
    this->docChangeFrom = from;
    this->docChangeOldLength = length;
  }
  else {
    iVar3 = from;
    if (iVar1 < from) {
      iVar3 = iVar1;
    }
    iVar2 = this->docChangeLength;
    iVar4 = iVar1 + iVar2;
    if (iVar1 + iVar2 < length + from) {
      iVar4 = length + from;
    }
    iVar4 = (iVar4 - iVar2) - iVar3;
    iVar1 = 0;
    if (0 < iVar4) {
      iVar1 = iVar4;
    }
    this->docChangeFrom = iVar3;
    this->docChangeOldLength = this->docChangeOldLength + iVar1;
    length = iVar1 + iVar2;
  }
  this->docChangeLength = length;
  return;
}

Assistant:

void QTextDocumentPrivate::documentChange(int from, int length)
{
//     qDebug("QTextDocumentPrivate::documentChange: from=%d,length=%d", from, length);
    if (docChangeFrom < 0) {
        docChangeFrom = from;
        docChangeOldLength = length;
        docChangeLength = length;
        return;
    }
    int start = qMin(from, docChangeFrom);
    int end = qMax(from + length, docChangeFrom + docChangeLength);
    int diff = qMax(0, end - start - docChangeLength);
    docChangeFrom = start;
    docChangeOldLength += diff;
    docChangeLength += diff;
}